

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_export(mbedtls_rsa_context *ctx,mbedtls_mpi *N,mbedtls_mpi *P,mbedtls_mpi *Q,
                      mbedtls_mpi *D,mbedtls_mpi *E)

{
  int iVar1;
  bool bVar2;
  int local_44;
  int is_priv;
  int ret;
  mbedtls_mpi *E_local;
  mbedtls_mpi *D_local;
  mbedtls_mpi *Q_local;
  mbedtls_mpi *P_local;
  mbedtls_mpi *N_local;
  mbedtls_rsa_context *ctx_local;
  
  iVar1 = mbedtls_mpi_cmp_int(&ctx->N,0);
  bVar2 = false;
  if (iVar1 != 0) {
    iVar1 = mbedtls_mpi_cmp_int(&ctx->P,0);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = mbedtls_mpi_cmp_int(&ctx->Q,0);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = mbedtls_mpi_cmp_int(&ctx->D,0);
        bVar2 = false;
        if (iVar1 != 0) {
          iVar1 = mbedtls_mpi_cmp_int(&ctx->E,0);
          bVar2 = iVar1 != 0;
        }
      }
    }
  }
  if ((bVar2) ||
     (((P == (mbedtls_mpi *)0x0 && (Q == (mbedtls_mpi *)0x0)) && (D == (mbedtls_mpi *)0x0)))) {
    if ((((((N == (mbedtls_mpi *)0x0) || (local_44 = mbedtls_mpi_copy(N,&ctx->N), local_44 == 0)) &&
          ((P == (mbedtls_mpi *)0x0 || (local_44 = mbedtls_mpi_copy(P,&ctx->P), local_44 == 0)))) &&
         ((Q == (mbedtls_mpi *)0x0 || (local_44 = mbedtls_mpi_copy(Q,&ctx->Q), local_44 == 0)))) &&
        ((D == (mbedtls_mpi *)0x0 || (local_44 = mbedtls_mpi_copy(D,&ctx->D), local_44 == 0)))) &&
       ((E == (mbedtls_mpi *)0x0 || (local_44 = mbedtls_mpi_copy(E,&ctx->E), local_44 == 0)))) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = local_44;
    }
  }
  else {
    ctx_local._4_4_ = -0x4080;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_export( const mbedtls_rsa_context *ctx,
                        mbedtls_mpi *N, mbedtls_mpi *P, mbedtls_mpi *Q,
                        mbedtls_mpi *D, mbedtls_mpi *E )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    int is_priv;
    RSA_VALIDATE_RET( ctx != NULL );

    /* Check if key is private or public */
    is_priv =
        mbedtls_mpi_cmp_int( &ctx->N, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->P, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->Q, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->D, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->E, 0 ) != 0;

    if( !is_priv )
    {
        /* If we're trying to export private parameters for a public key,
         * something must be wrong. */
        if( P != NULL || Q != NULL || D != NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    }

    /* Export all requested core parameters. */

    if( ( N != NULL && ( ret = mbedtls_mpi_copy( N, &ctx->N ) ) != 0 ) ||
        ( P != NULL && ( ret = mbedtls_mpi_copy( P, &ctx->P ) ) != 0 ) ||
        ( Q != NULL && ( ret = mbedtls_mpi_copy( Q, &ctx->Q ) ) != 0 ) ||
        ( D != NULL && ( ret = mbedtls_mpi_copy( D, &ctx->D ) ) != 0 ) ||
        ( E != NULL && ( ret = mbedtls_mpi_copy( E, &ctx->E ) ) != 0 ) )
    {
        return( ret );
    }

    return( 0 );
}